

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shifts.c
# Opt level: O0

uint32_t arm_shift_special_zero_behavior
                   (arm7tdmi_t *state,status_register_t *cpsr,shift_type_t type,uint32_t data)

{
  uint uVar1;
  uint in_ECX;
  uint in_EDX;
  uint *in_RSI;
  long in_RDI;
  uint32_t oldc;
  uint32_t in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint32_t local_4;
  
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] ----handling special case, immediate shift amount 0----\n");
  }
  switch(in_EDX) {
  case 0:
    local_4 = in_ECX;
    break;
  case 1:
    local_4 = arm_shift((status_register_t *)
                        CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),LSL,in_EDX,
                        in_stack_ffffffffffffffcc);
    break;
  case 2:
    local_4 = arm_shift((status_register_t *)
                        CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),LSL,in_EDX,
                        in_stack_ffffffffffffffcc);
    break;
  case 3:
    uVar1 = *(uint *)(in_RDI + 0xb4);
    if (in_RSI != (uint *)0x0) {
      *in_RSI = *in_RSI & 0xdfffffff | (uint)((in_ECX & 1) != 0) << 0x1d;
    }
    local_4 = (uVar1 >> 0x1d) << 0x1f | in_ECX >> 1;
    break;
  default:
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/shifts.c",
            0x85);
    fprintf(_stderr,"Unknown shift type: %d (this should never happen)\n\x1b[0;m",(ulong)in_EDX);
    exit(1);
  }
  return local_4;
}

Assistant:

word arm_shift_special_zero_behavior(arm7tdmi_t* state, status_register_t* cpsr, shift_type_t type, word data) {
    logdebug("----handling special case, immediate shift amount 0----")
    switch (type) {
        case LSL:
            return data; // Not affected.
        case LSR:
            // Treat it as LSR#32
            return arm_shift(cpsr, LSR, data, 32);
        case ASR:
            // Treat it as ASR#32
            return arm_shift(cpsr, ASR, data, 32);
        case ROR: {
            word oldc = state->cpsr.C;
            if (cpsr) {
                cpsr->C = data & 1u;
            }
            return (oldc << 31u) | (data >> 1u);
        }
        default:
            logfatal("Unknown shift type: %d (this should never happen)", type)
    }
}